

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v10::detail::write_escaped_string<char,fmt::v10::appender>
          (detail *this,appender out,basic_string_view<char> str)

{
  char *pcVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> *pbVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_90;
  value_type local_81;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_80;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_78;
  size_t local_70;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_68;
  undefined1 local_60 [8];
  find_escape_result<char> escape;
  iterator end;
  iterator begin;
  value_type local_29;
  undefined1 local_28 [8];
  basic_string_view<char> str_local;
  appender out_local;
  
  str_local.data_ = str.data_;
  local_29 = '\"';
  local_28 = (undefined1  [8])
             out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  str_local.size_ = (size_t)this;
  begin = (iterator)appender::operator++((appender *)&str_local.size_,0);
  pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*
                     ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)&begin);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_29);
  end = basic_string_view<char>::begin((basic_string_view<char> *)local_28);
  escape._16_8_ = basic_string_view<char>::end((basic_string_view<char> *)local_28);
  do {
    find_escape((find_escape_result<char> *)local_60,end,(char *)escape._16_8_);
    local_70 = str_local.size_;
    local_68.container =
         (buffer<char> *)copy_str<char,char_const*>(end,(char *)local_60,(appender)str_local.size_);
    pcVar1 = escape.begin;
    end = escape.begin;
    str_local.size_ = (size_t)local_68.container;
    if (escape.begin == (char *)0x0) break;
    local_80.container = local_68.container;
    local_78.container =
         (buffer<char> *)
         write_escaped_cp<fmt::v10::appender,char>
                   ((appender)local_68.container,(find_escape_result<char> *)local_60);
    str_local.size_ = (size_t)local_78.container;
  } while (pcVar1 != (char *)escape._16_8_);
  local_81 = '\"';
  local_90.container = (buffer<char> *)appender::operator++((appender *)&str_local.size_,0);
  pbVar2 = std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_90);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=(pbVar2,&local_81);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)str_local.size_;
}

Assistant:

auto write_escaped_string(OutputIt out, basic_string_view<Char> str)
    -> OutputIt {
  *out++ = static_cast<Char>('"');
  auto begin = str.begin(), end = str.end();
  do {
    auto escape = find_escape(begin, end);
    out = copy_str<Char>(begin, escape.begin, out);
    begin = escape.end;
    if (!begin) break;
    out = write_escaped_cp<OutputIt, Char>(out, escape);
  } while (begin != end);
  *out++ = static_cast<Char>('"');
  return out;
}